

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O1

void gimage::anon_unknown_8::writeRAWHeader(char *name,int type,long width,long height)

{
  char *pcVar1;
  char *name_00;
  undefined8 *puVar2;
  ulong uVar3;
  string s;
  Properties prop;
  allocator local_dd;
  int local_dc;
  char *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  long local_78;
  string local_70;
  undefined7 uStack_6f;
  long local_68;
  undefined1 local_60 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  long local_20;
  
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_dc = type;
  local_78 = height;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  local_20 = width;
  gutil::Properties::putValue<long>((Properties *)&local_50,"image.width",&local_20);
  gutil::Properties::putValue<long>((Properties *)&local_50,"image.height",&local_78);
  gutil::Properties::putValue<int>((Properties *)&local_50,"image.pixelsize",&local_dc);
  local_70 = (string)0x0;
  gutil::Properties::putValue<bool>((Properties *)&local_50,"image.msbfirst",(bool *)&local_70);
  std::__cxx11::string::string(&local_70,name,(allocator *)&local_d8);
  std::__cxx11::string::replace((ulong)&local_70,local_68 - 4,(char *)0x4,0x1534fd);
  name_00 = (char *)CONCAT71(uStack_6f,local_70);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"Header information of RAW File: ","");
  std::__cxx11::string::string((string *)&local_b8,name,&local_dd);
  uVar3 = 0xf;
  if (local_98 != local_88) {
    uVar3 = local_88[0];
  }
  if (uVar3 < (ulong)(local_b0 + local_90)) {
    uVar3 = 0xf;
    if (local_b8 != local_a8) {
      uVar3 = local_a8[0];
    }
    if ((ulong)(local_b0 + local_90) <= uVar3) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_98);
      goto LAB_001347b2;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_b8);
LAB_001347b2:
  local_d8 = (char *)&local_c8;
  pcVar1 = (char *)(puVar2 + 2);
  if ((char *)*puVar2 == pcVar1) {
    local_c8 = *(undefined8 *)pcVar1;
    uStack_c0 = puVar2[3];
  }
  else {
    local_c8 = *(undefined8 *)pcVar1;
    local_d8 = (char *)*puVar2;
  }
  local_d0 = puVar2[1];
  *puVar2 = pcVar1;
  puVar2[1] = 0;
  *pcVar1 = '\0';
  gutil::Properties::save((Properties *)&local_50,name_00,local_d8);
  if (local_d8 != (char *)&local_c8) {
    operator_delete(local_d8);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if ((undefined1 *)CONCAT71(uStack_6f,local_70) != local_60) {
    operator_delete((undefined1 *)CONCAT71(uStack_6f,local_70));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_50);
  return;
}

Assistant:

void writeRAWHeader(const char *name, int type, long width, long height)
{
  gutil::Properties prop;

  prop.putValue("image.width", width);
  prop.putValue("image.height", height);
  prop.putValue("image.pixelsize", type);
  prop.putValue("image.msbfirst", false);

  std::string s=name;
  s.replace(s.length()-4, 4, ".hdr");

  prop.save(s.c_str(), (std::string("Header information of RAW File: ")+std::string(name)).c_str());
}